

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarQueueReorderFromMousePos
               (ImGuiTabBar *tab_bar,ImGuiTabItem *src_tab,ImVec2 mouse_pos)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  int iVar5;
  ImGuiTabItem *pIVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_48;
  
  pIVar3 = GImGui;
  if (tab_bar->ReorderRequestTabId != 0) {
    __assert_fail("tab_bar->ReorderRequestTabId == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x1e75,
                  "void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar *, const ImGuiTabItem *, ImVec2)"
                 );
  }
  if ((tab_bar->Flags & 1) != 0) {
    fVar8 = 0.0;
    if ((src_tab->Flags & 0xc0) == 0) {
      fVar8 = tab_bar->ScrollingTarget;
    }
    fVar8 = (tab_bar->BarRect).Min.x - fVar8;
    fVar9 = src_tab->Offset + fVar8;
    local_48 = mouse_pos.x;
    iVar4 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,src_tab);
    iVar7 = iVar4;
    for (iVar5 = iVar4; (-1 < iVar5 && (iVar5 < (tab_bar->Tabs).Size));
        iVar5 = iVar5 + (uint)(fVar9 <= local_48) * 2 + -1) {
      pIVar6 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar5);
      if (((pIVar6->Flags & 0x20U) != 0) || (((pIVar6->Flags ^ src_tab->Flags) & 0xc0U) != 0))
      break;
      fVar10 = pIVar6->Offset + fVar8;
      fVar1 = (pIVar3->Style).ItemInnerSpacing.x;
      bVar2 = pIVar6->Width + fVar10 + fVar1 <= local_48;
      if (local_48 < fVar9) {
        bVar2 = local_48 <= fVar10 - fVar1;
      }
      iVar7 = iVar5;
      if (!bVar2) break;
    }
    if (iVar7 - iVar4 != 0) {
      TabBarQueueReorder(tab_bar,src_tab,iVar7 - iVar4);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar* tab_bar, const ImGuiTabItem* src_tab, ImVec2 mouse_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    if ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) == 0)
        return;

    const bool is_central_section = (src_tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    const float bar_offset = tab_bar->BarRect.Min.x - (is_central_section ? tab_bar->ScrollingTarget : 0);

    // Count number of contiguous tabs we are crossing over
    const int dir = (bar_offset + src_tab->Offset) > mouse_pos.x ? -1 : +1;
    const int src_idx = tab_bar->Tabs.index_from_ptr(src_tab);
    int dst_idx = src_idx;
    for (int i = src_idx; i >= 0 && i < tab_bar->Tabs.Size; i += dir)
    {
        // Reordered tabs must share the same section
        const ImGuiTabItem* dst_tab = &tab_bar->Tabs[i];
        if (dst_tab->Flags & ImGuiTabItemFlags_NoReorder)
            break;
        if ((dst_tab->Flags & ImGuiTabItemFlags_SectionMask_) != (src_tab->Flags & ImGuiTabItemFlags_SectionMask_))
            break;
        dst_idx = i;

        // Include spacing after tab, so when mouse cursor is between tabs we would not continue checking further tabs that are not hovered.
        const float x1 = bar_offset + dst_tab->Offset - g.Style.ItemInnerSpacing.x;
        const float x2 = bar_offset + dst_tab->Offset + dst_tab->Width + g.Style.ItemInnerSpacing.x;
        //GetForegroundDrawList()->AddRect(ImVec2(x1, tab_bar->BarRect.Min.y), ImVec2(x2, tab_bar->BarRect.Max.y), IM_COL32(255, 0, 0, 255));
        if ((dir < 0 && mouse_pos.x > x1) || (dir > 0 && mouse_pos.x < x2))
            break;
    }

    if (dst_idx != src_idx)
        TabBarQueueReorder(tab_bar, src_tab, dst_idx - src_idx);
}